

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_quantization_attribute_decoder.cc
# Opt level: O1

bool __thiscall
draco::SequentialQuantizationAttributeDecoder::Init
          (SequentialQuantizationAttributeDecoder *this,PointCloudDecoder *decoder,int attribute_id)

{
  bool bVar1;
  
  bVar1 = SequentialIntegerAttributeDecoder::Init
                    (&this->super_SequentialIntegerAttributeDecoder,decoder,attribute_id);
  if (bVar1) {
    bVar1 = *(int *)((long)(decoder->point_cloud_->attributes_).
                           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[attribute_id]._M_t.
                           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                           ._M_t + 0x1c) == 9;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SequentialQuantizationAttributeDecoder::Init(PointCloudDecoder *decoder,
                                                  int attribute_id) {
  if (!SequentialIntegerAttributeDecoder::Init(decoder, attribute_id)) {
    return false;
  }
  const PointAttribute *const attribute =
      decoder->point_cloud()->attribute(attribute_id);
  // Currently we can quantize only floating point arguments.
  if (attribute->data_type() != DT_FLOAT32) {
    return false;
  }
  return true;
}